

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O3

void __thiscall
opengv::absolute_pose::modules::Epnp::gauss_newton
          (Epnp *this,Matrix<double,_6,_10,_0,_6,_10> *L_6x10,Matrix<double,_6,_1,_0,_6,_1> *Rho,
          double *betas)

{
  int iVar1;
  Matrix<double,_4,_1,_0,_4,_1> X;
  Matrix<double,_6,_1,_0,_6,_1> B;
  Matrix<double,_6,_4,_0,_6,_4> A;
  Matrix<double,_4,_1,_0,_4,_1> local_1a0;
  Matrix<double,_6,_1,_0,_6,_1> local_170;
  Matrix<double,_6,_4,_0,_6,_4> local_140;
  
  iVar1 = 5;
  do {
    compute_A_and_b_gauss_newton(this,L_6x10,Rho,betas,&local_140,&local_170);
    qr_solve(this,&local_140,&local_170,&local_1a0);
    iVar1 = iVar1 + -1;
    *betas = local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
             .array[0] + *betas;
    betas[1] = local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
               m_data.array[1] + betas[1];
    betas[2] = local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
               m_data.array[2] + betas[2];
    betas[3] = local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
               m_data.array[3] + betas[3];
  } while (iVar1 != 0);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::gauss_newton(
    const Eigen::Matrix<double,6,10> & L_6x10,
    const Eigen::Matrix<double,6,1> & Rho,
    double betas[4])
{
  const int iterations_number = 5;

  Eigen::Matrix<double,6,4> A;
  Eigen::Matrix<double,6,1> B;
  Eigen::Matrix<double,4,1> X;

  for(int k = 0; k < iterations_number; k++)
  {
    compute_A_and_b_gauss_newton(L_6x10,Rho,betas,A,B);
    qr_solve(A,B,X);

    for(int i = 0; i < 4; i++)
      betas[i] += X[i];
  }
}